

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

int value_in_set_display_error(unsigned_long value,CheckIntegerSet *check_integer_set,int invert)

{
  uint in_EDX;
  char *pcVar1;
  long in_RSI;
  long in_RDI;
  size_t i;
  size_t size_of_set;
  unsigned_long *set;
  int succeeded;
  undefined8 in_stack_ffffffffffffffc8;
  ulong uVar2;
  char *in_stack_ffffffffffffffd0;
  ulong uVar3;
  char *in_stack_ffffffffffffffd8;
  long lVar4;
  uint uVar5;
  int local_4;
  
  uVar5 = in_EDX;
  _assert_true(CONCAT44(in_EDX,in_EDX),in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
               (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  lVar4 = *(long *)(in_RSI + 0x28);
  uVar3 = *(ulong *)(in_RSI + 0x30);
  uVar2 = 0;
  do {
    if (uVar3 <= uVar2) {
LAB_001049af:
      if (in_EDX == 0) {
        pcVar1 = "not ";
        if (uVar5 != 0) {
          pcVar1 = "";
        }
        cm_print_error("%lu is %sin the set (",in_RDI,pcVar1);
        for (uVar2 = 0; uVar2 < uVar3; uVar2 = uVar2 + 1) {
          cm_print_error("%#lx, ",*(undefined8 *)(lVar4 + uVar2 * 8));
        }
        cm_print_error(")\n");
        local_4 = 0;
      }
      else {
        local_4 = 1;
      }
      return local_4;
    }
    if (*(long *)(lVar4 + uVar2 * 8) == in_RDI) {
      in_EDX = (uint)((in_EDX != 0 ^ 0xffU) & 1);
      goto LAB_001049af;
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

static int value_in_set_display_error(
        const LargestIntegralType value,
        const CheckIntegerSet * const check_integer_set, const int invert) {
    int succeeded = invert;
    assert_non_null(check_integer_set);
    {
        const LargestIntegralType * const set = check_integer_set->set;
        const size_t size_of_set = check_integer_set->size_of_set;
        size_t i;
        for (i = 0; i < size_of_set; i++) {
            if (set[i] == value) {
                /* If invert = 0 and item is found, succeeded = 1. */
                /* If invert = 1 and item is found, succeeded = 0. */
                succeeded = !succeeded;
                break;
            }
        }
        if (succeeded) {
            return 1;
        }
        cm_print_error(LargestIntegralTypePrintfFormatDecimal
                       " is %sin the set (",
                       value, invert ? "" : "not ");
        for (i = 0; i < size_of_set; i++) {
            cm_print_error(LargestIntegralTypePrintfFormat ", ", set[i]);
        }
        cm_print_error(")\n");
    }
    return 0;
}